

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
* __thiscall
QPDFWriter::getWrittenXRefTable
          (map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
           *__return_storage_ptr__,QPDFWriter *this)

{
  element_type *peVar1;
  anon_class_16_2_6298776b local_58;
  function<void_(int,_const_QPDFWriter::NewObject_&)> local_48;
  iterator local_28;
  iterator it;
  QPDFWriter *this_local;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *result;
  
  it._M_node._7_1_ = 0;
  std::
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  ::map(__return_storage_ptr__);
  local_28 = std::
             map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
             ::begin(__return_storage_ptr__);
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_58.it = &local_28;
  local_58.result = __return_storage_ptr__;
  std::function<void(int,QPDFWriter::NewObject_const&)>::
  function<QPDFWriter::getWrittenXRefTable()::__0,void>
            ((function<void(int,QPDFWriter::NewObject_const&)> *)&local_48,&local_58);
  ObjTable<QPDFWriter::NewObject>::forEach
            (&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>,&local_48);
  std::function<void_(int,_const_QPDFWriter::NewObject_&)>::~function(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::map<QPDFObjGen, QPDFXRefEntry>
QPDFWriter::getWrittenXRefTable()
{
    std::map<QPDFObjGen, QPDFXRefEntry> result;

    auto it = result.begin();
    m->new_obj.forEach([&it, &result](auto id, auto const& item) -> void {
        if (item.xref.getType() != 0) {
            it = result.emplace_hint(it, QPDFObjGen(id, 0), item.xref);
        }
    });
    return result;
}